

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O1

mutex * absl::time_internal::cctz::anon_unknown_7::TimeZoneMutex(void)

{
  int iVar1;
  
  if ((anonymous_namespace)::TimeZoneMutex()::time_zone_mutex == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::TimeZoneMutex()::time_zone_mutex);
    if (iVar1 != 0) {
      TimeZoneMutex::time_zone_mutex = (mutex *)operator_new(0x28);
      *(undefined8 *)((long)&(TimeZoneMutex::time_zone_mutex->super___mutex_base)._M_mutex + 0x10) =
           0;
      (TimeZoneMutex::time_zone_mutex->super___mutex_base)._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (TimeZoneMutex::time_zone_mutex->super___mutex_base)._M_mutex.__align = 0;
      *(undefined8 *)((long)&(TimeZoneMutex::time_zone_mutex->super___mutex_base)._M_mutex + 8) = 0;
      (TimeZoneMutex::time_zone_mutex->super___mutex_base)._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      __cxa_guard_release(&(anonymous_namespace)::TimeZoneMutex()::time_zone_mutex);
    }
  }
  return TimeZoneMutex::time_zone_mutex;
}

Assistant:

std::mutex& TimeZoneMutex() {
  // This mutex is intentionally "leaked" to avoid the static deinitialization
  // order fiasco (std::mutex's destructor is not trivial on many platforms).
  static std::mutex* time_zone_mutex = new std::mutex;
  return *time_zone_mutex;
}